

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O0

void __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
::Population(Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             *this,uint32_t populationSize,uint32_t numGenes)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  size_t sVar4;
  reference this_00;
  Chromosome<Gen,_ComputeFitness> *c;
  iterator __end0;
  iterator __begin0;
  ChromosomeList *__range2;
  allocator<crsGA::Chromosome<Gen,_ComputeFitness>_> local_19;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t numGenes_local;
  uint32_t populationSize_local;
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *this_local;
  
  local_18 = numGenes;
  local_14 = populationSize;
  _numGenes_local = this;
  std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>::allocator(&local_19);
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::vector(&this->_chromosomes,(ulong)populationSize,&local_19);
  std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>::~allocator(&local_19);
  this->_fittestChromosomeIndex = 0;
  uVar2 = std::thread::hardware_concurrency();
  ThreadPool::ThreadPool(&this->_threadPool,(ulong)uVar2);
  sVar3 = std::
          vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          ::size(&this->_chromosomes);
  sVar4 = ThreadPool::getNumThreads(&this->_threadPool);
  this->_minPerThread = (uint32_t)(sVar3 / (sVar4 - 1));
  __end0 = std::
           vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::begin(&this->_chromosomes);
  c = (Chromosome<Gen,_ComputeFitness> *)
      std::
      vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
      ::end(&this->_chromosomes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
                                *)&c);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
              ::operator*(&__end0);
    Chromosome<Gen,_ComputeFitness>::setNumGenes(this_00,local_18);
    __gnu_cxx::
    __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

Population(uint32_t populationSize, uint32_t numGenes)
        : _chromosomes(populationSize),
          _fittestChromosomeIndex(0),
          _threadPool(),
          _minPerThread(_chromosomes.size() / (_threadPool.getNumThreads() - 1))
    {
        for (auto &c : _chromosomes)
        {
            c.setNumGenes(numGenes);
        }
    }